

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initLibrarianTool(VcprojGenerator *this)

{
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  VCConfiguration *conf;
  ProString *this_00;
  ProKey *in_stack_fffffffffffffef0;
  QMakeProject *this_01;
  QString *in_stack_fffffffffffffef8;
  ProKey *variableName;
  ProStringList *this_02;
  char *in_stack_ffffffffffffff18;
  ProKey local_80 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(in_stack_fffffffffffffef8,in_stack_ffffffffffffff18);
  this_00 = (ProString *)(in_RDI->m_superfile).d.size;
  variableName = local_80;
  ProKey::ProKey(in_stack_fffffffffffffef0,(char *)this_00);
  QMakeEvaluator::first(in_RDI,variableName);
  this_01 = (QMakeProject *)&stack0xffffffffffffffe0;
  ProString::toQString(this_00);
  QString::operator+=((QString *)this_01,&this_00->m_string);
  QString::~QString((QString *)0x2950a8);
  ProString::~ProString((ProString *)0x2950b2);
  ProKey::~ProKey((ProKey *)0x2950bc);
  this_02 = (ProStringList *)(in_RDI->m_superfile).d.size;
  ProKey::ProKey((ProKey *)this_01,(char *)this_00);
  QMakeProject::values(this_01,(ProKey *)this_00);
  ProStringList::toQStringList(this_02);
  QList<QString>::operator+=((QList<QString> *)this_01,(QList<QString> *)this_00);
  QList<QString>::~QList((QList<QString> *)0x295127);
  ProKey::~ProKey((ProKey *)0x295131);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initLibrarianTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.librarian.OutputFile = "$(OutDir)\\";
    conf.librarian.OutputFile += project->first("MSVCPROJ_TARGET").toQString();
    conf.librarian.AdditionalOptions += project->values("QMAKE_LIBFLAGS").toQStringList();
}